

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<char_const*,long,unsigned_long>
               (Imputer *model,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  bool bVar1;
  iterator node_00;
  iterator in_00;
  reference pvVar2;
  undefined4 in_ECX;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  ImputeNode *node;
  iterator __end2;
  iterator __begin2;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *__range2;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *tree;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  *__range1;
  size_t veclen;
  size_t data_sizets [6];
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_stack_ffffffffffffff28;
  char **in_stack_ffffffffffffff30;
  __normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_> *__lhs;
  size_t in_stack_ffffffffffffff38;
  undefined8 *n_els;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *vec;
  __normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_> local_90;
  reference buffer_00;
  undefined8 local_58;
  undefined8 local_50;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    *in_RDI = local_58;
    in_RDI[1] = local_50;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDX,CONCAT44(in_ECX,in_R8D));
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::resize((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
              *)in_RDX,CONCAT44(in_ECX,in_R8D));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_RDX,CONCAT44(in_ECX,in_R8D));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_RDX,CONCAT44(in_ECX,in_R8D));
    std::vector<int,_std::allocator<int>_>::shrink_to_fit
              ((vector<int,_std::allocator<int>_> *)0x674a8b);
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::shrink_to_fit((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                     *)0x674a9c);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x674aad);
    std::vector<int,_std::allocator<int>_>::shrink_to_fit
              ((vector<int,_std::allocator<int>_> *)0x674abe);
    __lhs = (__normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
             *)(in_RDI + 2);
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
    read_bytes<int,long>
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(char **)__lhs,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    n_els = in_RDI + 8;
    std::vector<double,_std::allocator<double>_>::size
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
    read_bytes<double,double>
              (in_stack_ffffffffffffff40,(size_t)n_els,(char **)__lhs,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    vec = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xb);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb));
    read_bytes<int,long>
              (vec,(size_t)n_els,(char **)__lhs,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
    node_00 = std::
              vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
              ::begin((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                       *)in_stack_ffffffffffffff28);
    in_00 = std::
            vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            ::end((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                               *)__lhs,(__normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                                        *)in_stack_ffffffffffffff28), bVar1) {
      pvVar2 = __gnu_cxx::
               __normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
               ::operator*((__normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                            *)&stack0xffffffffffffff90);
      read_bytes<unsigned_long,unsigned_long>
                (vec,(size_t)n_els,(char **)__lhs,
                 (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff28,false);
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::resize(in_RDX,CONCAT44(in_ECX,in_R8D));
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::shrink_to_fit
                ((vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x674c3d);
      buffer_00 = pvVar2;
      local_90._M_current =
           (ImputeNode *)
           std::vector<ImputeNode,_std::allocator<ImputeNode>_>::begin(in_stack_ffffffffffffff28);
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::end(in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>
                                       *)in_stack_ffffffffffffff28), bVar1) {
        __gnu_cxx::
        __normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>::
        operator*(&local_90);
        deserialize_node<char_const*,long,unsigned_long>
                  ((ImputeNode *)node_00._M_current,(char **)in_00._M_current,
                   (vector<char,_std::allocator<char>_> *)buffer_00,SUB81((ulong)pvVar2 >> 0x38,0));
        __gnu_cxx::
        __normal_iterator<ImputeNode_*,_std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>::
        operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_*,_std::vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>_>
                    *)&stack0xffffffffffffff90);
    }
  }
  return;
}

Assistant:

void deserialize_model(Imputer &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    size_t data_sizets[6];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)6, in, buffer, diff_endian);
    model.ncols_numeric = data_sizets[0];
    model.ncols_categ = data_sizets[1];
    model.ncat.resize(data_sizets[2]);
    model.imputer_tree.resize(data_sizets[3]);
    model.col_means.resize(data_sizets[4]);
    model.col_modes.resize(data_sizets[5]);

    model.ncat.shrink_to_fit();
    model.imputer_tree.shrink_to_fit();
    model.col_means.shrink_to_fit();
    model.col_modes.shrink_to_fit();

    read_bytes<int, saved_int_t>(model.ncat, model.ncat.size(), in, buffer, diff_endian);

    read_bytes<double, double>(model.col_means, model.col_means.size(), in, buffer, diff_endian);

    read_bytes<int, saved_int_t>(model.col_modes, model.col_modes.size(), in, buffer, diff_endian);

    size_t veclen;
    for (auto &tree : model.imputer_tree) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}